

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

void __thiscall
tinyusdz::primvar::PrimVar::set_value<tinyusdz::value::normal3f>(PrimVar *this,normal3f *v)

{
  storage_union local_20;
  undefined1 *local_10;
  
  local_10 = linb::any::vtable_for_type<tinyusdz::value::normal3f>()::table;
  local_20.dynamic = (void *)*(undefined8 *)v;
  local_20._8_4_ = v->z;
  linb::any::swap((any *)&local_20,(any *)this);
  if (local_10 != (undefined1 *)0x0) {
    (**(code **)(local_10 + 0x20))(&local_20);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }